

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

char * httplib::detail::find_content_type
                 (string *path,
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *user_data)

{
  bool bVar1;
  uint uVar2;
  _Self local_60 [3];
  _Self local_48;
  const_iterator it;
  string ext;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *user_data_local;
  string *path_local;
  
  file_extension((string *)&it,path);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(user_data,(string *)&it);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(user_data);
  bVar1 = std::operator!=(&local_48,local_60);
  if (bVar1) {
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_48);
    path_local = (string *)std::__cxx11::string::c_str();
    goto LAB_001c5a11;
  }
  uVar2 = str2tag((string *)&it);
  if (uVar2 == 0x76d) {
    path_local = (string *)anon_var_dwarf_e09fb;
    goto LAB_001c5a11;
  }
  if (uVar2 == 0xd3d) {
    path_local = (string *)anon_var_dwarf_e0a70;
    goto LAB_001c5a11;
  }
  if (uVar2 != 0xdd9) {
    if (uVar2 == 0x1a2c3) {
      path_local = (string *)anon_var_dwarf_e08a9;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1a2c6) {
      path_local = (string *)anon_var_dwarf_e08b6;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1a6df) {
      path_local = (string *)anon_var_dwarf_e0904;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1b0f1) {
LAB_001c56be:
      path_local = (string *)anon_var_dwarf_e08c3;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1b288) {
      path_local = (string *)anon_var_dwarf_e0911;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1c97d) {
LAB_001c5800:
      path_local = (string *)anon_var_dwarf_e095f;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1cb45) {
      path_local = (string *)anon_var_dwarf_e0945;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1d0f2) {
      path_local = (string *)anon_var_dwarf_e0a15;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1d1b9) {
      path_local = (string *)anon_var_dwarf_e091e;
      goto LAB_001c5a11;
    }
    if (uVar2 == 0x1d5fd) {
      path_local = (string *)anon_var_dwarf_e09c7;
      goto LAB_001c5a11;
    }
    if (uVar2 != 0x1db34) {
      if (uVar2 == 0x1de29) {
        path_local = (string *)anon_var_dwarf_e096c;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1de2e) {
        path_local = (string *)anon_var_dwarf_e0993;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1dee6) {
        path_local = (string *)anon_var_dwarf_e09d4;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1e078) {
        path_local = (string *)anon_var_dwarf_cbf5e;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1e147) {
        path_local = (string *)anon_var_dwarf_e0a3c;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1e25b) {
        path_local = (string *)anon_var_dwarf_e0952;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1e322) {
        path_local = (string *)anon_var_dwarf_e092b;
        goto LAB_001c5a11;
      }
      if (uVar2 == 0x1e692) {
        path_local = (string *)anon_var_dwarf_e0a2f;
        goto LAB_001c5a11;
      }
      if (uVar2 != 0x1f164) {
        if (uVar2 == 0x1f1d9) {
          path_local = (string *)anon_var_dwarf_e0a63;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x1f580) {
          path_local = (string *)anon_var_dwarf_e09ba;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x1f7f6) {
          path_local = (string *)anon_var_dwarf_e08dd;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x20a43) {
          path_local = (string *)anon_var_dwarf_e0a7d;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x371b38) {
          path_local = (string *)anon_var_dwarf_e08ea;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x372318) {
          path_local = (string *)anon_var_dwarf_e08f7;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x372b57) {
          path_local = (string *)anon_var_dwarf_e0a08;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x37cf7d) goto LAB_001c56be;
        if (uVar2 == 0x3adb38) {
          path_local = (string *)anon_var_dwarf_e0a22;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x3af938) goto LAB_001c5800;
        if (uVar2 == 0x3dad1f) {
          path_local = (string *)anon_var_dwarf_e0979;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x3daddb) {
          path_local = (string *)anon_var_dwarf_e09a0;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x3e2ddd) {
          path_local = (string *)anon_var_dwarf_e0952;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x3ff093) {
          path_local = (string *)anon_var_dwarf_e0a56;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x409760) {
          path_local = (string *)anon_var_dwarf_e0938;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x409771) {
          path_local = (string *)anon_var_dwarf_e09ad;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x40977d) {
          path_local = (string *)anon_var_dwarf_e0986;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x40a648) {
          path_local = (string *)anon_var_dwarf_e0a8a;
          goto LAB_001c5a11;
        }
        if (uVar2 == 0x40c278) {
          path_local = (string *)anon_var_dwarf_e09e1;
          goto LAB_001c5a11;
        }
        if (uVar2 != 0x43cec5) {
          if (uVar2 == 0x59114a) {
            path_local = (string *)anon_var_dwarf_e09ee;
          }
          else {
            path_local = (string *)0x0;
          }
          goto LAB_001c5a11;
        }
      }
      path_local = (string *)anon_var_dwarf_e0a49;
      goto LAB_001c5a11;
    }
  }
  path_local = (string *)anon_var_dwarf_e08d0;
LAB_001c5a11:
  std::__cxx11::string::~string((string *)&it);
  return (char *)path_local;
}

Assistant:

inline const char *
find_content_type(const std::string &path,
                  const std::map<std::string, std::string> &user_data) {
  auto ext = file_extension(path);

  auto it = user_data.find(ext);
  if (it != user_data.end()) { return it->second.c_str(); }

  using udl::operator""_t;

  switch (str2tag(ext)) {
  default: return nullptr;
  case "css"_t: return "text/css";
  case "csv"_t: return "text/csv";
  case "htm"_t:
  case "html"_t: return "text/html";
  case "js"_t:
  case "mjs"_t: return "text/javascript";
  case "txt"_t: return "text/plain";
  case "vtt"_t: return "text/vtt";

  case "apng"_t: return "image/apng";
  case "avif"_t: return "image/avif";
  case "bmp"_t: return "image/bmp";
  case "gif"_t: return "image/gif";
  case "png"_t: return "image/png";
  case "svg"_t: return "image/svg+xml";
  case "webp"_t: return "image/webp";
  case "ico"_t: return "image/x-icon";
  case "tif"_t: return "image/tiff";
  case "tiff"_t: return "image/tiff";
  case "jpg"_t:
  case "jpeg"_t: return "image/jpeg";

  case "mp4"_t: return "video/mp4";
  case "mpeg"_t: return "video/mpeg";
  case "webm"_t: return "video/webm";

  case "mp3"_t: return "audio/mp3";
  case "mpga"_t: return "audio/mpeg";
  case "weba"_t: return "audio/webm";
  case "wav"_t: return "audio/wave";

  case "otf"_t: return "font/otf";
  case "ttf"_t: return "font/ttf";
  case "woff"_t: return "font/woff";
  case "woff2"_t: return "font/woff2";

  case "7z"_t: return "application/x-7z-compressed";
  case "atom"_t: return "application/atom+xml";
  case "pdf"_t: return "application/pdf";
  case "json"_t: return "application/json";
  case "rss"_t: return "application/rss+xml";
  case "tar"_t: return "application/x-tar";
  case "xht"_t:
  case "xhtml"_t: return "application/xhtml+xml";
  case "xslt"_t: return "application/xslt+xml";
  case "xml"_t: return "application/xml";
  case "gz"_t: return "application/gzip";
  case "zip"_t: return "application/zip";
  case "wasm"_t: return "application/wasm";
  }
}